

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  istream *piVar1;
  long lVar2;
  argument_incorrect_type *this;
  istringstream is;
  istringstream aiStack_198 [16];
  long local_188;
  long local_178;
  long local_170;
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream(aiStack_198,(string *)text,_S_in);
  piVar1 = std::operator>>((istream *)aiStack_198,(string *)value);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    if (local_170 == local_178) {
      lVar2 = (**(code **)(local_188 + 0x38))();
      if (lVar2 == 0) {
        std::__cxx11::istringstream::~istringstream(aiStack_198);
        std::ios_base::~ios_base(local_120);
        return;
      }
    }
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cannot parse empty value",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  __cxa_throw(this,&argument_incorrect_type::typeinfo,OptionException::~OptionException);
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        std::cerr << "cannot parse empty value" << std::endl;
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }